

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O2

void sqlcheck::CheckValuesInDefinition
               (Configuration *state,string *sql_statement,bool *print_statement)

{
  bool bVar1;
  allocator local_a9;
  string title;
  regex pattern;
  string local_68;
  string local_48;
  
  bVar1 = IsDDLStatement(sql_statement);
  if (bVar1) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&pattern,"( enum)|( in \\()",0x10);
    std::__cxx11::string::string((string *)&title,"Values In Definition",&local_a9);
    std::__cxx11::string::string((string *)&local_48,(string *)&title);
    std::__cxx11::string::string((string *)&local_68,anon_var_dwarf_a9689,&local_a9);
    CheckPattern(state,sql_statement,print_statement,&pattern,RISK_LEVEL_MEDIUM,
                 PATTERN_TYPE_PHYSICAL_DATABASE_DESIGN,&local_48,&local_68,true,0);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&title);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&pattern);
  }
  return;
}

Assistant:

void CheckValuesInDefinition(Configuration& state,
                             const std::string& sql_statement,
                             bool& print_statement){

  auto ddl_statement = IsDDLStatement(sql_statement);
  if(ddl_statement == false){
    return;
  }

  std::regex pattern("( enum)|( in \\()");
  std::string title = "Values In Definition";
  PatternType pattern_type = PatternType::PATTERN_TYPE_PHYSICAL_DATABASE_DESIGN;

  auto message =
      "● Don't specify values in column definition:  "
      "With enum, you declare the values as strings, "
      "but internally the column is stored as the ordinal number of the string "
      "in the enumerated list. The storage is therefore compact, but when you "
      "sort a query by this column, the result is ordered by the ordinal value, "
      "not alphabetically by the string value. You may not expect this behavior. "
      "There's no syntax to add or remove a value from an ENUM or check constraint; "
      "you can only redefine the column with a new set of values. "
      "Moreover, if you make a value obsolete, you could upset historical data. "
      "As a matter of policy, changing metadata — that is, changing the definition "
      "of tables and columns—should be infrequent and with attention to testing and "
      "quality assurance. There's a better solution to restrict values in a column:  "
      "create a lookup table with one row for each value you allow. "
      "Then declare a foreign key constraint on the old table referencing "
      "the new table. "
      "Use metadata when validating against a fixed set of values. "
      "Use data when validating against a fluid set of values.";

  CheckPattern(state,
               sql_statement,
               print_statement,
               pattern,
               RISK_LEVEL_MEDIUM,
               pattern_type,
               title,
               message,
               true);

}